

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  byte endch;
  byte bVar1;
  char cVar2;
  char_t cVar3;
  char_t cVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  ulong uVar16;
  uintptr_t *puVar17;
  bool bVar18;
  byte bVar19;
  xml_encoding xVar20;
  undefined4 extraout_var;
  long lVar21;
  xml_node_struct *pxVar22;
  xml_attribute_struct *pxVar23;
  xml_node_struct *pxVar24;
  ulong uVar25;
  ushort uVar26;
  uint uVar27;
  uint uVar28;
  xml_parse_status xVar29;
  xml_parse_status xVar30;
  char *__function;
  ulong uVar31;
  long lVar32;
  char_t *pcVar33;
  ushort uVar34;
  xml_node_type type;
  ushort *puVar35;
  byte *pbVar36;
  char_t *pcVar37;
  xml_node_struct **ppxVar38;
  xml_node_struct *pxVar39;
  ushort *puVar40;
  undefined2 *puVar41;
  undefined2 *puVar42;
  ulong uVar43;
  xml_node_struct *pxVar44;
  xml_node_struct *pxVar45;
  size_t sVar46;
  size_t __n;
  xml_parse_result *pxVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  undefined1 auVar57 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [24];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  char_t *buffer;
  size_t length;
  xml_parser local_d0;
  xml_parse_result *local_b8;
  xml_node_struct *local_b0;
  xml_node_struct *local_a8;
  size_t local_a0;
  xml_node_struct *local_98;
  ulong local_90;
  xml_node_struct *local_88;
  uint local_7c;
  gap local_78;
  xml_node_struct *local_68;
  undefined8 local_60;
  xml_node_struct **local_58;
  code *local_50;
  code *local_48;
  ulong local_40;
  xml_node_struct *local_38;
  undefined1 auVar51 [16];
  undefined1 auVar55 [32];
  undefined1 auVar54 [32];
  undefined1 auVar56 [32];
  
  if (size != 0 && contents == (void *)0x0) {
    __return_storage_ptr__->offset = 0;
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_io_error;
    return __return_storage_ptr__;
  }
  xVar20 = get_buffer_encoding(encoding,contents,size);
  local_60 = CONCAT44(extraout_var,xVar20);
  local_a8 = (xml_node_struct *)0x0;
  local_a0 = 0;
  local_b8 = __return_storage_ptr__;
  local_88 = root;
  if (xVar20 == encoding_utf8) {
LAB_0011ef8d:
    bVar18 = get_mutable_buffer((char_t **)&local_a8,&local_a0,contents,size,is_mutable);
    goto LAB_0011efab;
  }
  if ((xVar20 & ~encoding_utf8) == encoding_utf16_le) {
    uVar25 = size >> 1;
    lVar21 = 0;
    if (xVar20 == encoding_utf16_le) {
      uVar31 = uVar25;
      puVar35 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar26 = *puVar35;
          if (uVar26 < 0xd800) {
            lVar32 = 3 - (ulong)(uVar26 < 0x800);
            if (uVar26 < 0x80) {
              lVar32 = 1;
            }
            lVar21 = lVar21 + lVar32;
LAB_0011f1f2:
            puVar40 = puVar35 + 1;
            lVar32 = -1;
          }
          else {
            if ((~uVar26 & 0xe000) == 0) {
              lVar21 = lVar21 + 3;
              goto LAB_0011f1f2;
            }
            puVar40 = puVar35 + 1;
            lVar32 = -1;
            if (((uVar31 != 1) && ((uVar26 & 0xfc00) == 0xd800)) && ((*puVar40 & 0xfc00) == 0xdc00))
            {
              lVar21 = lVar21 + 4;
              puVar40 = puVar35 + 2;
              lVar32 = -2;
            }
          }
          uVar31 = uVar31 + lVar32;
          puVar35 = puVar40;
        } while (uVar31 != 0);
      }
      uVar31 = lVar21 + 1;
      pxVar44 = (xml_node_struct *)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)(uVar31);
      bVar18 = pxVar44 != (xml_node_struct *)0x0;
      if (bVar18) {
        pxVar22 = pxVar44;
        puVar35 = (ushort *)contents;
        if (1 < size) {
          do {
            uVar26 = *puVar35;
            uVar28 = (uint)uVar26;
            if ((uVar26 < 0xd800) || ((~uVar26 & 0xe000) == 0)) {
              pxVar22 = (xml_node_struct *)utf8_writer::low((value_type)pxVar22,uVar28);
              puVar40 = puVar35 + 1;
              lVar32 = -1;
            }
            else {
              puVar40 = puVar35 + 1;
              lVar32 = -1;
              if ((uVar25 != 1) && ((uVar28 & 0xfc00) == 0xd800)) {
                uVar26 = *puVar40;
                if ((uVar26 & 0xfc00) == 0xdc00) {
                  uVar27 = (uVar28 << 10 & 0xffc00) + 0x10000;
                  *(byte *)&pxVar22->header = (byte)(uVar27 >> 0x12) | 0xf0;
                  *(byte *)((long)&pxVar22->header + 1) = (byte)(uVar27 >> 0xc) & 0x3f | 0x80;
                  *(byte *)((long)&pxVar22->header + 2) =
                       (byte)((uVar26 & 0x3c0 | uVar28 << 10) >> 6) & 0x3f | 0x80;
                  *(byte *)((long)&pxVar22->header + 3) = (byte)uVar26 & 0x3f | 0x80;
                  pxVar22 = (xml_node_struct *)((long)&pxVar22->header + 4);
                  puVar40 = puVar35 + 2;
                  lVar32 = -2;
                }
              }
            }
            uVar25 = uVar25 + lVar32;
            puVar35 = puVar40;
          } while (uVar25 != 0);
        }
        if (pxVar22 != (xml_node_struct *)((long)&pxVar44->header + lVar21)) {
          __function = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
          ;
LAB_001208ce:
          __assert_fail("oend == obegin + length",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x88e,__function);
        }
LAB_0011f7dc:
        *(char_t *)&pxVar22->header = '\0';
        local_a8 = pxVar44;
        local_a0 = uVar31;
        goto LAB_0011f7ee;
      }
    }
    else {
      uVar31 = uVar25;
      puVar35 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar26 = swap_bytes(*puVar35);
          if (uVar26 < 0xd800) {
            lVar32 = 3 - (ulong)(uVar26 < 0x800);
            if (uVar26 < 0x80) {
              lVar32 = 1;
            }
            lVar21 = lVar21 + lVar32;
LAB_0011f2ac:
            puVar40 = puVar35 + 1;
            lVar32 = -1;
          }
          else {
            if ((~uVar26 & 0xe000) == 0) {
              lVar21 = lVar21 + 3;
              goto LAB_0011f2ac;
            }
            puVar40 = puVar35 + 1;
            lVar32 = -1;
            if (((uVar31 != 1) && ((uVar26 & 0xfc00) == 0xd800)) && ((*puVar40 & 0xfc) == 0xdc)) {
              lVar21 = lVar21 + 4;
              puVar40 = puVar35 + 2;
              lVar32 = -2;
            }
          }
          uVar31 = uVar31 + lVar32;
          puVar35 = puVar40;
        } while (uVar31 != 0);
      }
      uVar31 = lVar21 + 1;
      pxVar44 = (xml_node_struct *)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)(uVar31);
      bVar18 = pxVar44 != (xml_node_struct *)0x0;
      if (bVar18) {
        pxVar22 = pxVar44;
        puVar42 = (undefined2 *)contents;
        if (1 < size) {
          do {
            uVar26 = swap_bytes(*puVar42);
            uVar28 = (uint)uVar26;
            if ((uVar26 < 0xd800) || ((~uVar28 & 0xe000) == 0)) {
              pxVar22 = (xml_node_struct *)utf8_writer::low((value_type)pxVar22,uVar28);
              puVar41 = puVar42 + 1;
              lVar32 = -1;
            }
            else {
              puVar41 = puVar42 + 1;
              lVar32 = -1;
              if ((uVar25 != 1) && ((uVar28 & 0xfc00) == 0xd800)) {
                uVar34 = swap_bytes(*puVar41);
                if ((uVar34 & 0xfc00) == 0xdc00) {
                  uVar28 = ((uint)uVar26 << 10 & 0xffc00) + 0x10000;
                  *(byte *)&pxVar22->header = (byte)(uVar28 >> 0x12) | 0xf0;
                  *(byte *)((long)&pxVar22->header + 1) = (byte)(uVar28 >> 0xc) & 0x3f | 0x80;
                  *(byte *)((long)&pxVar22->header + 2) =
                       (byte)((uVar34 & 0x3c0 | (uint)uVar26 << 10) >> 6) & 0x3f | 0x80;
                  *(byte *)((long)&pxVar22->header + 3) = (byte)uVar34 & 0x3f | 0x80;
                  pxVar22 = (xml_node_struct *)((long)&pxVar22->header + 4);
                  puVar41 = puVar42 + 2;
                  lVar32 = -2;
                }
              }
            }
            uVar25 = uVar25 + lVar32;
            puVar42 = puVar41;
          } while (uVar25 != 0);
        }
        if (pxVar22 != (xml_node_struct *)((long)&pxVar44->header + lVar21)) {
          __function = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
          ;
          goto LAB_001208ce;
        }
        goto LAB_0011f7dc;
      }
    }
LAB_0011efab:
    if (bVar18 == false) {
      local_b8->offset = 0;
      local_b8->encoding = encoding_auto;
      local_b8->status = status_out_of_memory;
      return local_b8;
    }
  }
  else {
    if (xVar20 - encoding_utf32_le < 2) {
      uVar25 = size >> 2;
      if (xVar20 == encoding_utf32_le) {
        if (size < 4) {
          lVar21 = 0;
        }
        else {
          auVar59 = vpbroadcastq_avx512f();
          auVar71 = ZEXT1664((undefined1  [16])0x0);
          uVar31 = 0;
          auVar60 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar56._8_4_ = 0x10000;
          auVar56._0_8_ = 0x1000000010000;
          auVar56._12_4_ = 0x10000;
          auVar56._16_4_ = 0x10000;
          auVar56._20_4_ = 0x10000;
          auVar56._24_4_ = 0x10000;
          auVar56._28_4_ = 0x10000;
          auVar66._8_4_ = 0x80;
          auVar66._0_8_ = 0x8000000080;
          auVar66._12_4_ = 0x80;
          auVar66._16_4_ = 0x80;
          auVar66._20_4_ = 0x80;
          auVar66._24_4_ = 0x80;
          auVar66._28_4_ = 0x80;
          auVar69._8_4_ = 0x800;
          auVar69._0_8_ = 0x80000000800;
          auVar69._12_4_ = 0x800;
          auVar69._16_4_ = 0x800;
          auVar69._20_4_ = 0x800;
          auVar69._24_4_ = 0x800;
          auVar69._28_4_ = 0x800;
          auVar61 = vpbroadcastq_avx512f(ZEXT816(4));
          do {
            auVar62 = vmovdqa64_avx512f(auVar71);
            auVar71 = vpbroadcastq_avx512f();
            auVar71 = vporq_avx512f(auVar71,auVar60);
            uVar16 = vpcmpuq_avx512f(auVar71,auVar59,2);
            auVar54 = vmovdqu32_avx512vl(*(undefined1 (*) [32])((long)contents + uVar31 * 4));
            lVar21 = CONCAT44((uint)((byte)(uVar16 >> 1) & 1) * auVar54._4_4_,
                              (uint)((byte)uVar16 & 1) * auVar54._0_4_);
            auVar51._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar54._8_4_;
            auVar51._0_8_ = lVar21;
            auVar51._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar54._12_4_;
            auVar53._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar54._16_4_;
            auVar53._0_16_ = auVar51;
            auVar53._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar54._20_4_;
            auVar55._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar54._24_4_;
            auVar55._0_24_ = auVar53;
            auVar55._28_4_ = (uint)(byte)(uVar16 >> 7) * auVar54._28_4_;
            uVar43 = vpcmpud_avx512vl(auVar55,auVar56,1);
            uVar49 = vpcmpud_avx512vl(auVar55,auVar66,5);
            uVar49 = uVar16 & uVar43 & uVar49;
            uVar50 = vpcmpud_avx512vl(auVar55,auVar69,5);
            uVar50 = uVar49 & uVar50;
            uVar48 = vpcmpud_avx512vl(auVar55,auVar69,1);
            uVar49 = uVar49 & uVar48;
            uVar48 = vpcmpud_avx512vl(auVar55,auVar66,1);
            uVar48 = uVar16 & uVar43 & uVar48;
            auVar63._8_8_ = 1;
            auVar63._0_8_ = 1;
            auVar63._16_8_ = 1;
            auVar63._24_8_ = 1;
            auVar63._32_8_ = 1;
            auVar63._40_8_ = 1;
            auVar63._48_8_ = 1;
            auVar63._56_8_ = 1;
            auVar71 = vpblendmq_avx512f(auVar61,auVar63);
            bVar18 = (bool)((byte)uVar48 & 1);
            bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar48 >> 2) & 1);
            bVar11 = (bool)((byte)(uVar48 >> 3) & 1);
            auVar63 = vpbroadcastq_avx512f(ZEXT816(2));
            bVar5 = (bool)((byte)uVar49 & 1);
            bVar8 = (bool)((byte)(uVar49 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar49 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar49 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar49 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar49 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar49 >> 6) & 1);
            auVar64 = vpbroadcastq_avx512f(ZEXT816(3));
            bVar6 = (bool)((byte)uVar50 & 1);
            auVar65._0_8_ =
                 (ulong)bVar6 * auVar64._0_8_ |
                 (ulong)!bVar6 *
                 ((ulong)bVar5 * auVar63._0_8_ |
                 (ulong)!bVar5 * ((ulong)bVar18 * auVar71._0_8_ | (ulong)!bVar18 * lVar21));
            bVar18 = (bool)((byte)(uVar50 >> 1) & 1);
            auVar65._8_8_ =
                 (ulong)bVar18 * auVar64._8_8_ |
                 (ulong)!bVar18 *
                 ((ulong)bVar8 * auVar63._8_8_ |
                 (ulong)!bVar8 * ((ulong)bVar7 * auVar71._8_8_ | (ulong)!bVar7 * auVar51._8_8_));
            bVar18 = (bool)((byte)(uVar50 >> 2) & 1);
            auVar65._16_8_ =
                 (ulong)bVar18 * auVar64._16_8_ |
                 (ulong)!bVar18 *
                 ((ulong)bVar10 * auVar63._16_8_ |
                 (ulong)!bVar10 * ((ulong)bVar9 * auVar71._16_8_ | (ulong)!bVar9 * auVar53._16_8_));
            bVar18 = (bool)((byte)(uVar50 >> 3) & 1);
            auVar65._24_8_ =
                 (ulong)bVar18 * auVar64._24_8_ |
                 (ulong)!bVar18 *
                 ((ulong)bVar12 * auVar63._24_8_ |
                 (ulong)!bVar12 * ((ulong)bVar11 * auVar71._24_8_ | (ulong)!bVar11 * auVar55._24_8_)
                 );
            bVar18 = (bool)((byte)(uVar50 >> 4) & 1);
            auVar65._32_8_ =
                 (ulong)bVar18 * auVar64._32_8_ |
                 (ulong)!bVar18 *
                 ((ulong)bVar13 * auVar63._32_8_ |
                 (ulong)!bVar13 * (ulong)((byte)(uVar48 >> 4) & 1) * auVar71._32_8_);
            bVar18 = (bool)((byte)(uVar50 >> 5) & 1);
            auVar65._40_8_ =
                 (ulong)bVar18 * auVar64._40_8_ |
                 (ulong)!bVar18 *
                 ((ulong)bVar14 * auVar63._40_8_ |
                 (ulong)!bVar14 * (ulong)((byte)(uVar48 >> 5) & 1) * auVar71._40_8_);
            bVar18 = (bool)((byte)(uVar50 >> 6) & 1);
            auVar65._48_8_ =
                 (ulong)bVar18 * auVar64._48_8_ |
                 (ulong)!bVar18 *
                 ((ulong)bVar15 * auVar63._48_8_ |
                 (ulong)!bVar15 * (ulong)((byte)(uVar48 >> 6) & 1) * auVar71._48_8_);
            auVar65._56_8_ =
                 (uVar50 >> 7) * auVar64._56_8_ |
                 (ulong)!SUB81(uVar50 >> 7,0) *
                 ((uVar49 >> 7) * auVar63._56_8_ |
                 (ulong)!SUB81(uVar49 >> 7,0) * (uVar48 >> 7) * auVar71._56_8_);
            auVar71 = vpaddq_avx512f(auVar62,auVar65);
            uVar31 = uVar31 + 8;
          } while ((uVar25 + 7 & 0xfffffffffffffff8) != uVar31);
          auVar59 = vmovdqa64_avx512f(auVar71);
          bVar18 = (bool)((byte)uVar16 & 1);
          auVar60._0_8_ = (ulong)bVar18 * auVar59._0_8_ | (ulong)!bVar18 * auVar62._0_8_;
          bVar18 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar60._8_8_ = (ulong)bVar18 * auVar59._8_8_ | (ulong)!bVar18 * auVar62._8_8_;
          bVar18 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar60._16_8_ = (ulong)bVar18 * auVar59._16_8_ | (ulong)!bVar18 * auVar62._16_8_;
          bVar18 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar60._24_8_ = (ulong)bVar18 * auVar59._24_8_ | (ulong)!bVar18 * auVar62._24_8_;
          bVar18 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar60._32_8_ = (ulong)bVar18 * auVar59._32_8_ | (ulong)!bVar18 * auVar62._32_8_;
          bVar18 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar60._40_8_ = (ulong)bVar18 * auVar59._40_8_ | (ulong)!bVar18 * auVar62._40_8_;
          bVar18 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar60._48_8_ = (ulong)bVar18 * auVar59._48_8_ | (ulong)!bVar18 * auVar62._48_8_;
          auVar60._56_8_ =
               (uVar16 >> 7) * auVar59._56_8_ | (ulong)!SUB81(uVar16 >> 7,0) * auVar62._56_8_;
          auVar54 = vextracti64x4_avx512f(auVar60,1);
          auVar59 = vpaddq_avx512f(auVar60,ZEXT3264(auVar54));
          auVar51 = vpaddq_avx(auVar59._0_16_,auVar59._16_16_);
          auVar52 = vpshufd_avx(auVar51,0xee);
          auVar51 = vpaddq_avx(auVar51,auVar52);
          lVar21 = auVar51._0_8_;
        }
        uVar31 = lVar21 + 1;
        pxVar44 = (xml_node_struct *)
                  (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                            allocate)(uVar31);
        bVar18 = pxVar44 != (xml_node_struct *)0x0;
        if (bVar18) {
          pxVar22 = pxVar44;
          if (3 < size) {
            uVar43 = 0;
            do {
              uVar28 = *(uint *)((long)contents + uVar43 * 4);
              if (uVar28 < 0x10000) {
                pxVar22 = (xml_node_struct *)utf8_writer::low((value_type)pxVar22,uVar28);
              }
              else {
                *(byte *)&pxVar22->header = (byte)(uVar28 >> 0x12) | 0xf0;
                *(byte *)((long)&pxVar22->header + 1) = (byte)(uVar28 >> 0xc) & 0x3f | 0x80;
                *(byte *)((long)&pxVar22->header + 2) = (byte)(uVar28 >> 6) & 0x3f | 0x80;
                *(byte *)((long)&pxVar22->header + 3) = (byte)uVar28 & 0x3f | 0x80;
                pxVar22 = (xml_node_struct *)((long)&pxVar22->header + 4);
              }
              uVar43 = uVar43 + 1;
            } while (uVar25 != uVar43);
          }
          if (pxVar22 != (xml_node_struct *)((long)&pxVar44->header + lVar21)) {
            __function = 
            "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
            ;
            goto LAB_001208ce;
          }
          goto LAB_0011f7dc;
        }
      }
      else {
        if (size < 4) {
          lVar21 = 0;
        }
        else {
          auVar59 = vpbroadcastq_avx512f();
          auVar71 = ZEXT1664((undefined1  [16])0x0);
          uVar31 = 0;
          auVar60 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar54._16_16_ = _DAT_001810f0;
          auVar54._0_16_ = _DAT_001810f0;
          auVar67._8_4_ = 0x10000;
          auVar67._0_8_ = 0x1000000010000;
          auVar67._12_4_ = 0x10000;
          auVar67._16_4_ = 0x10000;
          auVar67._20_4_ = 0x10000;
          auVar67._24_4_ = 0x10000;
          auVar67._28_4_ = 0x10000;
          auVar68._8_4_ = 0x80;
          auVar68._0_8_ = 0x8000000080;
          auVar68._12_4_ = 0x80;
          auVar68._16_4_ = 0x80;
          auVar68._20_4_ = 0x80;
          auVar68._24_4_ = 0x80;
          auVar68._28_4_ = 0x80;
          auVar70._8_4_ = 0x800;
          auVar70._0_8_ = 0x80000000800;
          auVar70._12_4_ = 0x800;
          auVar70._16_4_ = 0x800;
          auVar70._20_4_ = 0x800;
          auVar70._24_4_ = 0x800;
          auVar70._28_4_ = 0x800;
          auVar61 = vpbroadcastq_avx512f(ZEXT816(4));
          do {
            auVar63 = vmovdqa64_avx512f(auVar71);
            auVar71 = vpbroadcastq_avx512f();
            auVar71 = vporq_avx512f(auVar71,auVar60);
            uVar16 = vpcmpuq_avx512f(auVar71,auVar59,2);
            auVar56 = vmovdqu32_avx512vl(*(undefined1 (*) [32])((long)contents + uVar31 * 4));
            auVar57._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar56._4_4_;
            auVar57._0_4_ = (uint)((byte)uVar16 & 1) * auVar56._0_4_;
            auVar57._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar56._8_4_;
            auVar57._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar56._12_4_;
            auVar57._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar56._16_4_;
            auVar57._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar56._20_4_;
            auVar57._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar56._24_4_;
            auVar57._28_4_ = (uint)(byte)(uVar16 >> 7) * auVar56._28_4_;
            auVar56 = vpshufb_avx2(auVar57,auVar54);
            uVar43 = vpcmpud_avx512vl(auVar56,auVar67,1);
            uVar49 = vpcmpud_avx512vl(auVar56,auVar68,5);
            uVar49 = uVar16 & uVar43 & uVar49;
            uVar50 = vpcmpud_avx512vl(auVar56,auVar70,5);
            uVar50 = uVar49 & uVar50;
            uVar48 = vpcmpud_avx512vl(auVar56,auVar70,1);
            uVar49 = uVar49 & uVar48;
            uVar48 = vpcmpud_avx512vl(auVar56,auVar68,1);
            uVar48 = uVar16 & uVar43 & uVar48;
            auVar71._8_8_ = 1;
            auVar71._0_8_ = 1;
            auVar71._16_8_ = 1;
            auVar71._24_8_ = 1;
            auVar71._32_8_ = 1;
            auVar71._40_8_ = 1;
            auVar71._48_8_ = 1;
            auVar71._56_8_ = 1;
            auVar71 = vpblendmq_avx512f(auVar61,auVar71);
            bVar18 = (bool)((byte)uVar48 & 1);
            bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar48 >> 2) & 1);
            bVar11 = (bool)((byte)(uVar48 >> 3) & 1);
            auVar62 = vpbroadcastq_avx512f(ZEXT816(2));
            bVar5 = (bool)((byte)uVar49 & 1);
            bVar8 = (bool)((byte)(uVar49 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar49 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar49 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar49 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar49 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar49 >> 6) & 1);
            auVar65 = vpbroadcastq_avx512f(ZEXT816(3));
            bVar6 = (bool)((byte)uVar50 & 1);
            auVar64._0_8_ =
                 (ulong)bVar6 * auVar65._0_8_ |
                 (ulong)!bVar6 *
                 ((ulong)bVar5 * auVar62._0_8_ |
                 (ulong)!bVar5 * ((ulong)bVar18 * auVar71._0_8_ | (ulong)!bVar18 * auVar56._0_8_));
            bVar18 = (bool)((byte)(uVar50 >> 1) & 1);
            auVar64._8_8_ =
                 (ulong)bVar18 * auVar65._8_8_ |
                 (ulong)!bVar18 *
                 ((ulong)bVar8 * auVar62._8_8_ |
                 (ulong)!bVar8 * ((ulong)bVar7 * auVar71._8_8_ | (ulong)!bVar7 * auVar56._8_8_));
            bVar18 = (bool)((byte)(uVar50 >> 2) & 1);
            auVar64._16_8_ =
                 (ulong)bVar18 * auVar65._16_8_ |
                 (ulong)!bVar18 *
                 ((ulong)bVar10 * auVar62._16_8_ |
                 (ulong)!bVar10 * ((ulong)bVar9 * auVar71._16_8_ | (ulong)!bVar9 * auVar56._16_8_));
            bVar18 = (bool)((byte)(uVar50 >> 3) & 1);
            auVar64._24_8_ =
                 (ulong)bVar18 * auVar65._24_8_ |
                 (ulong)!bVar18 *
                 ((ulong)bVar12 * auVar62._24_8_ |
                 (ulong)!bVar12 * ((ulong)bVar11 * auVar71._24_8_ | (ulong)!bVar11 * auVar56._24_8_)
                 );
            bVar18 = (bool)((byte)(uVar50 >> 4) & 1);
            auVar64._32_8_ =
                 (ulong)bVar18 * auVar65._32_8_ |
                 (ulong)!bVar18 *
                 ((ulong)bVar13 * auVar62._32_8_ |
                 (ulong)!bVar13 * (ulong)((byte)(uVar48 >> 4) & 1) * auVar71._32_8_);
            bVar18 = (bool)((byte)(uVar50 >> 5) & 1);
            auVar64._40_8_ =
                 (ulong)bVar18 * auVar65._40_8_ |
                 (ulong)!bVar18 *
                 ((ulong)bVar14 * auVar62._40_8_ |
                 (ulong)!bVar14 * (ulong)((byte)(uVar48 >> 5) & 1) * auVar71._40_8_);
            bVar18 = (bool)((byte)(uVar50 >> 6) & 1);
            auVar64._48_8_ =
                 (ulong)bVar18 * auVar65._48_8_ |
                 (ulong)!bVar18 *
                 ((ulong)bVar15 * auVar62._48_8_ |
                 (ulong)!bVar15 * (ulong)((byte)(uVar48 >> 6) & 1) * auVar71._48_8_);
            auVar64._56_8_ =
                 (uVar50 >> 7) * auVar65._56_8_ |
                 (ulong)!SUB81(uVar50 >> 7,0) *
                 ((uVar49 >> 7) * auVar62._56_8_ |
                 (ulong)!SUB81(uVar49 >> 7,0) * (uVar48 >> 7) * auVar71._56_8_);
            auVar71 = vpaddq_avx512f(auVar63,auVar64);
            uVar31 = uVar31 + 8;
          } while ((uVar25 + 7 & 0xfffffffffffffff8) != uVar31);
          auVar60 = vmovdqa64_avx512f(auVar71);
          bVar18 = (bool)((byte)uVar16 & 1);
          auVar59._0_8_ = (ulong)bVar18 * auVar60._0_8_ | (ulong)!bVar18 * auVar63._0_8_;
          bVar18 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar59._8_8_ = (ulong)bVar18 * auVar60._8_8_ | (ulong)!bVar18 * auVar63._8_8_;
          bVar18 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar59._16_8_ = (ulong)bVar18 * auVar60._16_8_ | (ulong)!bVar18 * auVar63._16_8_;
          bVar18 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar59._24_8_ = (ulong)bVar18 * auVar60._24_8_ | (ulong)!bVar18 * auVar63._24_8_;
          bVar18 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar59._32_8_ = (ulong)bVar18 * auVar60._32_8_ | (ulong)!bVar18 * auVar63._32_8_;
          bVar18 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar59._40_8_ = (ulong)bVar18 * auVar60._40_8_ | (ulong)!bVar18 * auVar63._40_8_;
          bVar18 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar59._48_8_ = (ulong)bVar18 * auVar60._48_8_ | (ulong)!bVar18 * auVar63._48_8_;
          auVar59._56_8_ =
               (uVar16 >> 7) * auVar60._56_8_ | (ulong)!SUB81(uVar16 >> 7,0) * auVar63._56_8_;
          auVar54 = vextracti64x4_avx512f(auVar59,1);
          auVar59 = vpaddq_avx512f(auVar59,ZEXT3264(auVar54));
          auVar51 = vpaddq_avx(auVar59._0_16_,auVar59._16_16_);
          auVar52 = vpshufd_avx(auVar51,0xee);
          auVar51 = vpaddq_avx(auVar51,auVar52);
          lVar21 = auVar51._0_8_;
        }
        uVar31 = lVar21 + 1;
        pxVar44 = (xml_node_struct *)
                  (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                            allocate)(uVar31);
        bVar18 = pxVar44 != (xml_node_struct *)0x0;
        if (bVar18) {
          pxVar22 = pxVar44;
          if (3 < size) {
            uVar43 = 0;
            do {
              uVar28 = swap_bytes(*(undefined4 *)((long)contents + uVar43 * 4));
              if (uVar28 < 0x10000) {
                pxVar22 = (xml_node_struct *)utf8_writer::low((value_type)pxVar22,uVar28);
              }
              else {
                *(byte *)&pxVar22->header = (byte)(uVar28 >> 0x12) | 0xf0;
                *(byte *)((long)&pxVar22->header + 1) = (byte)(uVar28 >> 0xc) & 0x3f | 0x80;
                *(byte *)((long)&pxVar22->header + 2) = (byte)(uVar28 >> 6) & 0x3f | 0x80;
                *(byte *)((long)&pxVar22->header + 3) = (byte)uVar28 & 0x3f | 0x80;
                pxVar22 = (xml_node_struct *)((long)&pxVar22->header + 4);
              }
              uVar43 = uVar43 + 1;
            } while (uVar25 != uVar43);
          }
          if (pxVar22 != (xml_node_struct *)((long)&pxVar44->header + lVar21)) {
            __function = 
            "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
            ;
            goto LAB_001208ce;
          }
          goto LAB_0011f7dc;
        }
      }
      goto LAB_0011efab;
    }
    if (xVar20 != encoding_latin1) {
      __assert_fail("false && \"Invalid encoding\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x8e3,
                    "bool pugi::impl::(anonymous namespace)::convert_buffer(char_t *&, size_t &, xml_encoding, const void *, size_t, bool)"
                   );
    }
    sVar46 = 0;
    __n = sVar46;
    if (size != 0) {
      do {
        __n = sVar46;
        if (*(char *)((long)contents + sVar46) < '\0') break;
        sVar46 = sVar46 + 1;
        __n = size;
      } while (size != sVar46);
    }
    if (size <= __n) goto LAB_0011ef8d;
    lVar21 = size - __n;
    if (lVar21 == 0) {
      lVar32 = 0;
    }
    else {
      auVar59 = vpbroadcastq_avx512f();
      auVar71 = ZEXT1664((undefined1  [16])0x0);
      uVar25 = 0;
      auVar60 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar61 = vpbroadcastq_avx512f(ZEXT816(1));
      do {
        auVar63 = vmovdqa64_avx512f(auVar71);
        auVar71 = vpbroadcastq_avx512f();
        auVar71 = vporq_avx512f(auVar71,auVar60);
        uVar31 = vpcmpuq_avx512f(auVar71,auVar59,2);
        auVar51 = vmovdqu8_avx512vl(*(undefined1 (*) [16])((long)contents + uVar25 + __n));
        uVar43 = CONCAT17((char)(uVar31 >> 7) * auVar51[7],
                          CONCAT16(((byte)(uVar31 >> 6) & 1) * auVar51[6],
                                   CONCAT15(((byte)(uVar31 >> 5) & 1) * auVar51[5],
                                            CONCAT14(((byte)(uVar31 >> 4) & 1) * auVar51[4],
                                                     CONCAT13(((byte)(uVar31 >> 3) & 1) * auVar51[3]
                                                              ,CONCAT12(((byte)(uVar31 >> 2) & 1) *
                                                                        auVar51[2],
                                                                        CONCAT11(((byte)(uVar31 >> 1
                                                                                        ) & 1) *
                                                                                 auVar51[1],
                                                                                 ((byte)uVar31 & 1)
                                                                                 * auVar51[0])))))))
        ;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = uVar43;
        uVar49 = vpmovb2m_avx512vl(auVar52);
        auVar62._8_8_ = 2;
        auVar62._0_8_ = 2;
        auVar62._16_8_ = 2;
        auVar62._24_8_ = 2;
        auVar62._32_8_ = 2;
        auVar62._40_8_ = 2;
        auVar62._48_8_ = 2;
        auVar62._56_8_ = 2;
        auVar71 = vpblendmq_avx512f(auVar61,auVar62);
        bVar18 = (bool)((byte)uVar49 & 1);
        auVar58._0_8_ = (ulong)bVar18 * auVar71._0_8_ | !bVar18 * uVar43;
        auVar58._8_8_ = (ulong)((byte)(uVar49 >> 1) & 1) * auVar71._8_8_;
        auVar58._16_8_ = (ulong)((byte)(uVar49 >> 2) & 1) * auVar71._16_8_;
        auVar58._24_8_ = (ulong)((byte)(uVar49 >> 3) & 1) * auVar71._24_8_;
        auVar58._32_8_ = (ulong)((byte)(uVar49 >> 4) & 1) * auVar71._32_8_;
        auVar58._40_8_ = (ulong)((byte)(uVar49 >> 5) & 1) * auVar71._40_8_;
        auVar58._48_8_ = (ulong)((byte)(uVar49 >> 6) & 1) * auVar71._48_8_;
        auVar58._56_8_ = (ulong)((byte)(uVar49 >> 7) & 1) * auVar71._56_8_;
        auVar71 = vpaddq_avx512f(auVar58,auVar63);
        uVar25 = uVar25 + 8;
      } while ((lVar21 + 7U & 0xfffffffffffffff8) != uVar25);
      auVar59 = vmovdqa64_avx512f(auVar71);
      bVar18 = (bool)((byte)uVar31 & 1);
      auVar61._0_8_ = (ulong)bVar18 * auVar59._0_8_ | (ulong)!bVar18 * auVar63._0_8_;
      bVar18 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar61._8_8_ = (ulong)bVar18 * auVar59._8_8_ | (ulong)!bVar18 * auVar63._8_8_;
      bVar18 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar61._16_8_ = (ulong)bVar18 * auVar59._16_8_ | (ulong)!bVar18 * auVar63._16_8_;
      bVar18 = (bool)((byte)(uVar31 >> 3) & 1);
      auVar61._24_8_ = (ulong)bVar18 * auVar59._24_8_ | (ulong)!bVar18 * auVar63._24_8_;
      bVar18 = (bool)((byte)(uVar31 >> 4) & 1);
      auVar61._32_8_ = (ulong)bVar18 * auVar59._32_8_ | (ulong)!bVar18 * auVar63._32_8_;
      bVar18 = (bool)((byte)(uVar31 >> 5) & 1);
      auVar61._40_8_ = (ulong)bVar18 * auVar59._40_8_ | (ulong)!bVar18 * auVar63._40_8_;
      bVar18 = (bool)((byte)(uVar31 >> 6) & 1);
      auVar61._48_8_ = (ulong)bVar18 * auVar59._48_8_ | (ulong)!bVar18 * auVar63._48_8_;
      auVar61._56_8_ =
           (uVar31 >> 7) * auVar59._56_8_ | (ulong)!SUB81(uVar31 >> 7,0) * auVar63._56_8_;
      auVar54 = vextracti64x4_avx512f(auVar61,1);
      auVar59 = vpaddq_avx512f(auVar61,ZEXT3264(auVar54));
      auVar51 = vpaddq_avx(auVar59._0_16_,auVar59._16_16_);
      auVar52 = vpshufd_avx(auVar51,0xee);
      auVar51 = vpaddq_avx(auVar51,auVar52);
      lVar32 = auVar51._0_8_;
    }
    uVar25 = lVar32 + 1 + __n;
    pxVar44 = (xml_node_struct *)
              (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::allocate
              )();
    bVar18 = pxVar44 != (xml_node_struct *)0x0;
    if (pxVar44 == (xml_node_struct *)0x0) goto LAB_0011efab;
    lVar32 = lVar32 + __n;
    memcpy(pxVar44,contents,__n);
    pcVar33 = (char_t *)((long)&pxVar44->header + __n);
    if (lVar21 != 0) {
      do {
        pcVar33 = utf8_writer::low(pcVar33,(uint)*(byte *)((long)contents + __n));
        __n = __n + 1;
      } while (size != __n);
    }
    if (pcVar33 != (char_t *)((long)&pxVar44->header + lVar32)) {
      __assert_fail("oend == obegin + length",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x8bc,
                    "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                   );
    }
    *pcVar33 = '\0';
    local_a8 = pxVar44;
    local_a0 = uVar25;
  }
LAB_0011f7ee:
  pxVar44 = local_a8;
  pxVar47 = local_b8;
  if (own) {
    if (contents != (void *)0x0 && local_a8 != (xml_node_struct *)contents) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (contents);
    }
    if (pxVar44 != (xml_node_struct *)contents || own) {
LAB_0011f830:
      *out_buffer = (char_t *)local_a8;
    }
  }
  else if (local_a8 != (xml_node_struct *)contents) goto LAB_0011f830;
  doc->buffer = (char_t *)local_a8;
  if (local_a0 == 0) {
    pxVar47->offset = 0;
    pxVar47->encoding = encoding_auto;
    pxVar47->status = ~options >> 8 & status_no_document_element;
LAB_001206fc:
    pxVar47->encoding = (xml_encoding)local_60;
    return pxVar47;
  }
  if (local_88->first_child == (xml_node_struct *)0x0) {
    local_68 = (xml_node_struct *)0x0;
  }
  else {
    local_68 = local_88->first_child->prev_sibling_c;
  }
  local_d0.alloc = &doc->super_xml_allocator;
  if (doc == (xml_document_struct *)0x0) {
    local_d0.alloc = (xml_allocator *)0x0;
  }
  local_d0.error_offset = (char_t *)0x0;
  local_d0.error_status = status_ok;
  endch = *(byte *)((long)local_a8 + (local_a0 - 1));
  *(char_t *)((long)local_a8 + (local_a0 - 1)) = '\0';
  pxVar44 = local_a8;
  if (((char_t)local_a8->header == 0xef) && (*(char_t *)((long)&local_a8->header + 1) == 0xbb)) {
    pxVar44 = (xml_node_struct *)
              ((long)&local_a8->header +
              (ulong)(*(char_t *)((long)&local_a8->header + 2) == 0xbf) * 3);
  }
  local_38 = local_a8;
  local_58 = &local_88->first_child;
  local_40 = local_a0;
  local_90 = local_a0 - 1;
  local_48 = (code *)(&PTR_parse_simple_001bf3d0)[options >> 4 & 0xf];
  local_50 = (code *)(&PTR_parse_001bf450)[(options >> 4 & 3) + (options >> 0xb & 1) * 4];
  local_7c = options & 0x22;
  pxVar22 = local_88;
LAB_0011f982:
  pxVar24 = pxVar44;
  cVar4 = (char_t)pxVar24->header;
  if (cVar4 == '\0') {
LAB_00120661:
    if (pxVar22 != local_88) {
      local_d0.error_status = status_end_element_mismatch;
      local_d0.error_offset = (char_t *)pxVar24;
    }
    goto LAB_00120676;
  }
  if (cVar4 != '<') {
    lVar21 = 0;
    do {
      lVar32 = lVar21;
      bVar19 = *(byte *)((long)&pxVar24->header + lVar32);
      lVar21 = lVar32 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar19] & 8) != 0);
    if ((bVar19 == 0x3c) || (bVar19 == 0)) {
      if (lVar21 == 1) {
        __assert_fail("mark != s",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0xd63,
                      "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                     );
      }
      pxVar44 = (xml_node_struct *)((long)&pxVar24->header + lVar32);
      if (((options >> 0xb & 1) != 0 || (options & 0x408) == 0) ||
         (((options >> 10 & 1) != 0 &&
          (((bVar19 != 0x3c || (*(char_t *)((long)&pxVar24->header + lVar21) != '/')) ||
           (pxVar22->first_child != (xml_node_struct *)0x0)))))) goto LAB_0011f982;
    }
    pxVar44 = (xml_node_struct *)((long)&pxVar24->header + lVar32);
    if ((options >> 0xb & 1) == 0) {
      pxVar44 = pxVar24;
    }
    pxVar24 = pxVar44;
    if (((options >> 0xc & 1) == 0) && (pxVar22->parent == (xml_node_struct *)0x0)) {
      do {
        cVar4 = (char_t)pxVar24->header;
        if (cVar4 == '\0') goto LAB_00120661;
        pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 1);
      } while (cVar4 != '<');
      goto LAB_0011fa86;
    }
    if ((((options >> 0xd & 1) != 0) && (pxVar22->parent != (xml_node_struct *)0x0)) &&
       ((pxVar22->first_child == (xml_node_struct *)0x0 && (pxVar22->value == (char_t *)0x0)))) {
      pxVar22->value = (char_t *)pxVar24;
LAB_0011fa65:
      pxVar24 = (xml_node_struct *)(*local_50)(pxVar24);
      if ((char_t)pxVar24->header == '\0') goto LAB_00120661;
      goto LAB_0011fa86;
    }
    pxVar44 = append_new_node(pxVar22,local_d0.alloc,node_pcdata);
    if (pxVar44 != (xml_node_struct *)0x0) {
      pxVar44->value = (char_t *)pxVar24;
      pxVar22 = pxVar44->parent;
      goto LAB_0011fa65;
    }
LAB_00120802:
    local_d0.error_offset = (char_t *)pxVar24;
    local_d0.error_status = status_out_of_memory;
    goto LAB_00120676;
  }
  pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 1);
LAB_0011fa86:
  bVar19 = (byte)pxVar24->header;
  if (-1 < (char)(anonymous_namespace)::chartype_table[bVar19]) {
    if (bVar19 == 0x21) {
      cVar4 = *(char_t *)((long)&pxVar24->header + 1);
      if (cVar4 == '[') {
        if (*(char_t *)((long)&pxVar24->header + 2) == 'C') {
          if (*(char_t *)((long)&pxVar24->header + 3) == 'D') {
            if (*(char_t *)((long)&pxVar24->header + 4) == 'A') {
              if (*(char_t *)((long)&pxVar24->header + 5) == 'T') {
                if (*(char_t *)((long)&pxVar24->header + 6) == 'A') {
                  if (*(char_t *)((long)&pxVar24->header + 7) == '[') {
                    pxVar24 = (xml_node_struct *)&pxVar24->name;
                    if ((options & 4) == 0) {
                      do {
                        if (*(char_t *)&pxVar24->header == ']') {
                          if (*(char_t *)((long)&pxVar24->header + 1) == ']') {
                            cVar4 = *(char_t *)((long)&pxVar24->header + 2);
                            local_b0 = pxVar22;
                            if ((cVar4 == '>') || (endch == 0x3e && cVar4 == '\0'))
                            goto LAB_001205f0;
                          }
                        }
                        else {
                          local_b0 = pxVar22;
                          if (*(char_t *)&pxVar24->header == '\0') goto LAB_00120609;
                        }
                        pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 1);
                      } while( true );
                    }
                    local_b0 = pxVar22;
                    pxVar44 = append_new_node(pxVar22,local_d0.alloc,node_cdata);
                    if (pxVar44 == (xml_node_struct *)0x0) {
                      local_d0.error_status = status_out_of_memory;
                      pxVar44 = (xml_node_struct *)0x0;
                      pxVar22 = local_b0;
                      local_d0.error_offset = (char_t *)pxVar24;
                    }
                    else {
                      pxVar44->value = (char_t *)pxVar24;
                      if ((options & 0x20) == 0) {
LAB_00120510:
                        if (*(char_t *)&pxVar24->header == ']') {
                          if (*(char_t *)((long)&pxVar24->header + 1) != ']') goto LAB_0012054b;
                          cVar4 = *(char_t *)((long)&pxVar24->header + 2);
                          if ((cVar4 != '>') && (endch != 0x3e || cVar4 != '\0')) goto LAB_0012054b;
                          *(char_t *)&pxVar24->header = '\0';
LAB_001205f0:
                          pcVar33 = (char_t *)((long)&pxVar24->header + 1);
                          goto LAB_001205f3;
                        }
                        if (*(char_t *)&pxVar24->header != '\0') goto LAB_0012054b;
                        goto LAB_00120609;
                      }
                      pcVar33 = strconv_cdata((char_t *)pxVar24,endch);
                      if (pcVar33 == (char_t *)0x0) {
                        pxVar24 = (xml_node_struct *)pxVar44->value;
LAB_00120609:
                        local_d0.error_offset = (char_t *)pxVar24;
                        local_d0.error_status = status_bad_cdata;
                        pxVar44 = (xml_node_struct *)0x0;
                        pxVar22 = local_b0;
                        pxVar47 = local_b8;
                      }
                      else {
LAB_001205f3:
                        pxVar44 = (xml_node_struct *)(pcVar33 + (ulong)(pcVar33[1] == '>') + 1);
                        pxVar22 = local_b0;
                        pxVar47 = local_b8;
                      }
                    }
                    goto LAB_001204b8;
                  }
                  local_d0.error_offset = (char_t *)((long)&pxVar24->header + 7);
                }
                else {
                  local_d0.error_offset = (char_t *)((long)&pxVar24->header + 6);
                }
              }
              else {
                local_d0.error_offset = (char_t *)((long)&pxVar24->header + 5);
              }
            }
            else {
              local_d0.error_offset = (char_t *)((long)&pxVar24->header + 4);
            }
          }
          else {
            local_d0.error_offset = (char_t *)((long)&pxVar24->header + 3);
          }
        }
        else {
          local_d0.error_offset = (char_t *)((long)&pxVar24->header + 2);
        }
LAB_001204ad:
        local_d0.error_status = status_bad_cdata;
        goto LAB_001204b5;
      }
      if (cVar4 != 'D') {
        if (cVar4 != '-') goto LAB_0011fe86;
        if (*(char_t *)((long)&pxVar24->header + 2) == '-') {
          pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 3);
          pxVar44 = pxVar22;
          if ((options & 2) == 0) {
LAB_0011fc41:
            if (local_7c != 0x22) {
              do {
                cVar4 = (char_t)pxVar24->header;
                if (cVar4 == '-') {
                  if (*(char_t *)((long)&pxVar24->header + 1) == '-') {
                    cVar4 = *(char_t *)((long)&pxVar24->header + 2);
                    if ((cVar4 == '>') || (endch == 0x3e && cVar4 == '\0')) {
                      if ((options & 2) != 0) {
                        *(char_t *)&pxVar24->header = '\0';
                      }
                      pxVar44 = (xml_node_struct *)
                                ((long)&pxVar24->header +
                                (ulong)(*(char_t *)((long)&pxVar24->header + 2) == '>') + 2);
                      goto LAB_001204b8;
                    }
                  }
                }
                else if (cVar4 == '\0') goto LAB_0011ffc7;
                pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 1);
              } while( true );
            }
            local_78.end = (char_t *)0x0;
            local_78.size = 0;
            local_98 = pxVar44;
LAB_0011fc5b:
            do {
              pxVar44 = pxVar24;
              if (((anonymous_namespace)::chartype_table[(byte)pxVar24->header] & 0x20) == 0) {
                if (((anonymous_namespace)::chartype_table[*(byte *)((long)&pxVar24->header + 1)] &
                    0x20) != 0) {
                  pxVar44 = (xml_node_struct *)((long)&pxVar24->header + 1);
                  goto LAB_0011fd5a;
                }
                if (((anonymous_namespace)::chartype_table[*(byte *)((long)&pxVar24->header + 2)] &
                    0x20) != 0) {
                  pxVar44 = (xml_node_struct *)((long)&pxVar24->header + 2);
                  goto LAB_0011fd5a;
                }
                bVar18 = ((anonymous_namespace)::chartype_table
                          [*(byte *)((long)&pxVar24->header + 3)] & 0x20) == 0;
                if (bVar18) {
                  pxVar44 = (xml_node_struct *)((long)&pxVar24->header + 4);
                }
                else {
                  pxVar44 = (xml_node_struct *)((long)&pxVar24->header + 3);
                }
              }
              else {
LAB_0011fd5a:
                bVar18 = false;
              }
              pxVar24 = pxVar44;
            } while (bVar18);
            cVar2 = (char)pxVar44->header;
            if (cVar2 == '\r') {
              pxVar24 = (xml_node_struct *)((long)&pxVar44->header + 1);
              *(undefined1 *)&pxVar44->header = 10;
              if (*(char *)((long)&pxVar44->header + 1) == '\n') {
                if ((xml_node_struct *)local_78.end != (xml_node_struct *)0x0) {
                  if (pxVar24 < local_78.end) {
                    __assert_fail("s >= end",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                                  ,0x974,
                                  "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)"
                                 );
                  }
                  memmove((void *)((long)local_78.end - local_78.size),local_78.end,
                          (long)pxVar24 - (long)local_78.end);
                }
                pxVar24 = (xml_node_struct *)((long)&pxVar44->header + 2);
                local_78.size = local_78.size + 1;
                local_78.end = (char_t *)pxVar24;
              }
              goto LAB_0011fc5b;
            }
            if (cVar2 == '-') {
              if ((*(char *)((long)&pxVar44->header + 1) == '-') &&
                 ((cVar2 = *(char *)((long)&pxVar44->header + 2), cVar2 == '>' ||
                  (endch == 0x3e && cVar2 == '\0')))) {
                pcVar33 = gap::flush(&local_78,(char_t *)pxVar44);
                *pcVar33 = '\0';
                pxVar44 = (xml_node_struct *)
                          ((long)&pxVar44->header +
                          (ulong)(*(char *)((long)&pxVar44->header + 2) == '>') + 2);
                goto LAB_00120099;
              }
            }
            else if (cVar2 == '\0') goto LAB_00120096;
            pxVar24 = (xml_node_struct *)((long)&pxVar44->header + 1);
            goto LAB_0011fc5b;
          }
          pxVar44 = append_new_node(pxVar22,local_d0.alloc,node_comment);
          pxVar47 = local_b8;
          if (pxVar44 != (xml_node_struct *)0x0) {
            pxVar44->value = (char_t *)pxVar24;
            goto LAB_0011fc41;
          }
          local_d0.error_status = status_out_of_memory;
          pxVar44 = (xml_node_struct *)0x0;
          local_d0.error_offset = (char_t *)pxVar24;
          goto LAB_001204b8;
        }
        pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 2);
        goto LAB_0011ffc7;
      }
      if ((((*(char_t *)((long)&pxVar24->header + 2) != 'O') ||
           (*(char_t *)((long)&pxVar24->header + 3) != 'C')) ||
          (*(char_t *)((long)&pxVar24->header + 4) != 'T')) ||
         ((*(char_t *)((long)&pxVar24->header + 5) != 'Y' ||
          (*(char_t *)((long)&pxVar24->header + 6) != 'P')))) {
LAB_0011fe86:
        local_d0.error_offset = (char_t *)((long)&pxVar24->header + 1);
        if ((endch != 0x2d) || (pxVar24 = (xml_node_struct *)local_d0.error_offset, cVar4 != '\0'))
        {
          if ((endch == 0x5b) && (cVar4 == '\0')) goto LAB_001204ad;
          local_d0.error_status = status_unrecognized_tag;
          goto LAB_001204b5;
        }
        goto LAB_0011ffc7;
      }
      cVar3 = *(char_t *)((long)&pxVar24->header + 7);
      if ((cVar3 != 'E') && (endch != 0x45 || cVar3 != '\0')) goto LAB_0011fe86;
      pxVar44 = (xml_node_struct *)((long)&pxVar24[-1].first_attribute + 7);
      if (pxVar22->parent != (xml_node_struct *)0x0) {
        local_d0.error_status = status_bad_doctype;
        local_d0.error_offset = (char_t *)pxVar44;
        goto LAB_001204b5;
      }
      local_b0 = pxVar22;
      pxVar44 = (xml_node_struct *)
                xml_parser::parse_doctype_group(&local_d0,(char_t *)pxVar44,endch);
      if (pxVar44 == (xml_node_struct *)0x0) {
LAB_00120639:
        pxVar44 = (xml_node_struct *)0x0;
        pxVar22 = local_b0;
      }
      else {
        cVar2 = (char)pxVar44->header;
        if ((cVar2 != '>') && (endch != 0x3e || cVar2 != '\0')) {
          __assert_fail("(*s == 0 && endch == \'>\') || *s == \'>\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0xc39,
                        "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_exclamation(char_t *, xml_node_struct *, unsigned int, char_t)"
                       );
        }
        if (cVar2 != '\0') {
          *(undefined1 *)&pxVar44->header = 0;
          pxVar44 = (xml_node_struct *)((long)&pxVar44->header + 1);
        }
        pxVar22 = local_b0;
        if ((options >> 9 & 1) != 0) {
          pcVar33 = (char_t *)((long)&pxVar24->header + 7);
          do {
            pbVar36 = pcVar33 + 1;
            pcVar33 = pcVar33 + 1;
          } while (((anonymous_namespace)::chartype_table[*pbVar36] & 8) != 0);
          pxVar22 = append_new_node(local_b0,local_d0.alloc,node_doctype);
          if (pxVar22 == (xml_node_struct *)0x0) {
            local_d0.error_status = status_out_of_memory;
            local_d0.error_offset = (char_t *)pxVar44;
            goto LAB_00120639;
          }
          pxVar22->value = pcVar33;
          pxVar22 = local_b0;
        }
      }
      goto LAB_001204b8;
    }
    if (bVar19 == 0x3f) {
      pxVar44 = (xml_node_struct *)((long)&pxVar24->header + 1);
      bVar19 = *(byte *)((long)&pxVar24->header + 1);
      if (-1 < (char)(anonymous_namespace)::chartype_table[bVar19]) goto LAB_0011fbcf;
      lVar21 = 4;
      pcVar33 = (char_t *)((long)&pxVar24->header + 3);
      pxVar45 = pxVar44;
      do {
        pxVar39 = pxVar45;
        pcVar37 = pcVar33;
        bVar1 = (byte)pxVar39->header;
        pxVar45 = (xml_node_struct *)((long)&pxVar39->header + 1);
        lVar21 = lVar21 + -1;
        pcVar33 = pcVar37 + 1;
      } while (((anonymous_namespace)::chartype_table[bVar1] & 0x40) != 0);
      pxVar47 = local_b8;
      if (bVar1 == 0) {
LAB_0011ff92:
        local_d0.error_status = status_bad_pi;
        pxVar44 = (xml_node_struct *)0x0;
        local_d0.error_offset = (char_t *)pxVar39;
      }
      else {
        if (((bVar19 & 0xdf) == 0x58) && ((pxVar24->header & 0xdf0000) == 0x4d0000)) {
          bVar18 = lVar21 == 0 && (pxVar24->header & 0xdf000000) == 0x4c000000;
        }
        else {
          bVar18 = false;
        }
        uVar28 = 1;
        if (bVar18) {
          uVar28 = 0x100;
        }
        if ((options & uVar28) == 0) {
          do {
            cVar4 = (char_t)pxVar39->header;
            if (cVar4 == '?') {
              cVar4 = *(char_t *)((long)&pxVar39->header + 1);
              if ((cVar4 == '>') || (endch == 0x3e && cVar4 == '\0')) {
                pxVar44 = (xml_node_struct *)((long)&pxVar39->header + (ulong)(cVar4 == '>') + 1);
                goto LAB_001201a0;
              }
            }
            else if (cVar4 == '\0') goto LAB_0012007d;
            pxVar39 = (xml_node_struct *)((long)&pxVar39->header + 1);
          } while( true );
        }
        if (bVar18) {
          if (pxVar22->parent != (xml_node_struct *)0x0) goto LAB_0011ff92;
          type = node_declaration;
        }
        else {
          type = node_pi;
        }
        local_b0 = pxVar22;
        local_98 = pxVar44;
        pxVar22 = append_new_node(pxVar22,local_d0.alloc,type);
        pxVar47 = local_b8;
        if (pxVar22 == (xml_node_struct *)0x0) {
          local_d0.error_status = status_out_of_memory;
          pxVar44 = (xml_node_struct *)0x0;
          pxVar22 = local_b0;
          local_d0.error_offset = (char_t *)pxVar39;
        }
        else {
          pxVar22->name = (char_t *)local_98;
          uVar25 = (ulong)(byte)pxVar39->header;
          *(char_t *)&pxVar39->header = '\0';
          if (uVar25 == 0x3f) {
            cVar4 = (char_t)pxVar45->header;
            if ((cVar4 == '>') || (endch == 0x3e && cVar4 == '\0')) {
              pxVar44 = (xml_node_struct *)((long)&pxVar45->header + (ulong)(cVar4 == '>'));
              pxVar22 = pxVar22->parent;
            }
            else {
              local_d0.error_status = status_bad_pi;
              pxVar44 = (xml_node_struct *)0x0;
              pxVar22 = local_b0;
              local_d0.error_offset = (char_t *)pxVar45;
            }
          }
          else {
            pxVar44 = pxVar39;
            if (((anonymous_namespace)::chartype_table[uVar25] & 8) != 0) {
              do {
                pcVar33 = pcVar37;
                puVar17 = &pxVar44->header;
                pxVar44 = (xml_node_struct *)((long)&pxVar44->header + 1);
                pcVar37 = pcVar33 + 1;
              } while (((anonymous_namespace)::chartype_table[*(byte *)((long)puVar17 + 1)] & 8) !=
                       0);
              do {
                if (pcVar33[-1] == '?') {
                  if ((*pcVar33 == '>') || (endch == 0x3e && *pcVar33 == '\0')) {
                    if (bVar18) {
                      pcVar33[-1] = '/';
                    }
                    else {
                      pxVar22->value = (char_t *)pxVar44;
                      pxVar22 = pxVar22->parent;
                      pcVar33[-1] = '\0';
                      pxVar44 = (xml_node_struct *)(pcVar33 + (*pcVar33 == '>'));
                    }
                    goto LAB_001201a0;
                  }
                }
                else if (pcVar33[-1] == '\0') goto LAB_00120479;
                pcVar33 = pcVar33 + 1;
              } while( true );
            }
            local_d0.error_status = status_bad_pi;
            pxVar44 = (xml_node_struct *)0x0;
            pxVar22 = local_b0;
            local_d0.error_offset = (char_t *)pxVar45;
          }
        }
      }
      goto LAB_001201a0;
    }
    if (bVar19 != 0x2f) {
      local_d0.error_status = (endch == 0x3f && bVar19 == 0) + status_unrecognized_tag;
      local_d0.error_offset = (char_t *)pxVar24;
      goto LAB_00120676;
    }
    pxVar45 = (xml_node_struct *)((long)&pxVar24->header + 1);
    pbVar36 = pxVar22->name;
    xVar30 = status_end_element_mismatch;
    xVar29 = status_end_element_mismatch;
    pxVar24 = pxVar45;
    if (pbVar36 != (byte *)0x0) {
LAB_0011fac4:
      bVar19 = (byte)pxVar24->header;
      xVar30 = xVar29;
      if (((anonymous_namespace)::chartype_table[bVar19] & 0x40) != 0) goto code_r0x0011fad1;
      if (*pbVar36 == 0) {
        pxVar22 = pxVar22->parent;
        pxVar44 = pxVar24;
        do {
          pxVar24 = pxVar44;
          bVar19 = (byte)pxVar24->header;
          pxVar44 = (xml_node_struct *)((long)&pxVar24->header + 1);
        } while (((anonymous_namespace)::chartype_table[bVar19] & 8) != 0);
        pxVar45 = pxVar24;
        if (bVar19 != 0) {
          if (bVar19 == 0x3e) {
            bVar18 = true;
            goto LAB_001200e3;
          }
          xVar30 = status_bad_end_element;
          goto LAB_001200d5;
        }
        bVar18 = true;
        pxVar44 = pxVar24;
        xVar30 = status_bad_end_element;
        if (endch != 0x3e) goto LAB_001200d5;
        goto LAB_001200e3;
      }
      if (((bVar19 == 0) && (*pbVar36 == endch)) && (pbVar36[1] == 0)) {
        pxVar45 = pxVar24;
        xVar30 = status_bad_end_element;
      }
    }
LAB_001200d5:
    bVar18 = false;
    pxVar44 = pxVar24;
    local_d0.error_offset = (char_t *)pxVar45;
    local_d0.error_status = xVar30;
LAB_001200e3:
    if (!bVar18) goto LAB_00120676;
    goto LAB_0011f982;
  }
  pxVar22 = append_new_node(pxVar22,local_d0.alloc,node_element);
  if (pxVar22 == (xml_node_struct *)0x0) goto LAB_00120802;
  pxVar22->name = (char_t *)pxVar24;
  do {
    if (((anonymous_namespace)::chartype_table[(byte)pxVar24->header] & 0x40) == 0) {
LAB_0011fb50:
      bVar19 = 0;
    }
    else {
      if (((anonymous_namespace)::chartype_table[*(byte *)((long)&pxVar24->header + 1)] & 0x40) == 0
         ) {
        pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 1);
        goto LAB_0011fb50;
      }
      if (((anonymous_namespace)::chartype_table[*(byte *)((long)&pxVar24->header + 2)] & 0x40) == 0
         ) {
        pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 2);
        goto LAB_0011fb50;
      }
      bVar19 = ((anonymous_namespace)::chartype_table[*(byte *)((long)&pxVar24->header + 3)] & 0x40)
               >> 6;
      if (bVar19 == 0) {
        pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 3);
      }
      else {
        pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 4);
      }
    }
  } while (bVar19 != 0);
  bVar19 = (byte)pxVar24->header;
  uVar25 = (ulong)bVar19;
  pxVar44 = (xml_node_struct *)((long)&pxVar24->header + 1);
  *(char_t *)&pxVar24->header = '\0';
  if (uVar25 == 0x3e) goto LAB_0011f982;
  if (((anonymous_namespace)::chartype_table[uVar25] & 8) != 0) goto LAB_001201c1;
  if (uVar25 == 0) {
    pxVar44 = pxVar24;
    if (endch == 0x3e) goto LAB_0011f982;
  }
  else {
    pxVar24 = pxVar44;
    if (bVar19 != 0x2f) goto LAB_00120833;
    cVar4 = (char_t)pxVar44->header;
    if ((cVar4 == '>') || (endch == 0x3e && cVar4 == '\0')) {
      pxVar22 = pxVar22->parent;
      pxVar44 = (xml_node_struct *)((long)&pxVar44->header + (ulong)(cVar4 == '>'));
      goto LAB_0011f982;
    }
  }
  goto LAB_00120833;
LAB_0012054b:
  pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 1);
  goto LAB_00120510;
LAB_00120096:
  pxVar44 = (xml_node_struct *)0x0;
LAB_00120099:
  if (pxVar44 == (xml_node_struct *)0x0) {
    pxVar24 = (xml_node_struct *)local_98->value;
LAB_0011ffc7:
    local_d0.error_offset = (char_t *)pxVar24;
    local_d0.error_status = status_bad_comment;
LAB_001204b5:
    pxVar44 = (xml_node_struct *)0x0;
  }
LAB_001204b8:
  if (pxVar44 == (xml_node_struct *)0x0) goto LAB_00120676;
  goto LAB_0011f982;
LAB_0012007d:
  local_d0.error_status = status_bad_pi;
  pxVar44 = (xml_node_struct *)0x0;
  local_d0.error_offset = (char_t *)pxVar39;
  goto LAB_001201a0;
LAB_00120479:
  pxVar22 = local_b0;
  pxVar44 = (xml_node_struct *)(pcVar33 + -1);
LAB_0011fbcf:
  local_d0.error_offset = (char_t *)pxVar44;
  local_d0.error_status = status_bad_pi;
  pxVar44 = (xml_node_struct *)0x0;
LAB_001201a0:
  if (pxVar44 == (xml_node_struct *)0x0) goto LAB_00120676;
  if (pxVar22 == (xml_node_struct *)0x0) {
    __assert_fail("cursor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0xd4f,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
  if ((pxVar22->header & 0xf) != 7) goto LAB_0011f982;
LAB_001201c1:
  while( true ) {
    do {
      pxVar24 = pxVar44;
      bVar19 = (byte)pxVar24->header;
      pxVar44 = (xml_node_struct *)((long)&pxVar24->header + 1);
    } while (((anonymous_namespace)::chartype_table[bVar19] & 8) != 0);
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar19]) break;
    pxVar23 = append_new_attribute(pxVar22,local_d0.alloc);
    if (pxVar23 == (xml_attribute_struct *)0x0) {
      pxVar44 = pxVar24;
      xVar30 = status_out_of_memory;
LAB_001202c5:
      bVar18 = false;
      local_d0.error_offset = (char_t *)pxVar44;
      local_d0.error_status = xVar30;
    }
    else {
      pxVar23->name = (char_t *)pxVar24;
      do {
        if (((anonymous_namespace)::chartype_table[(byte)pxVar24->header] & 0x40) == 0) {
LAB_00120248:
          bVar19 = 0;
        }
        else {
          if (((anonymous_namespace)::chartype_table[*(byte *)((long)&pxVar24->header + 1)] & 0x40)
              == 0) {
            pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 1);
            goto LAB_00120248;
          }
          if (((anonymous_namespace)::chartype_table[*(byte *)((long)&pxVar24->header + 2)] & 0x40)
              == 0) {
            pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 2);
            goto LAB_00120248;
          }
          bVar19 = ((anonymous_namespace)::chartype_table[*(byte *)((long)&pxVar24->header + 3)] &
                   0x40) >> 6;
          if (bVar19 == 0) {
            pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 3);
          }
          else {
            pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 4);
          }
        }
      } while (bVar19 != 0);
      bVar19 = (byte)pxVar24->header;
      *(char_t *)&pxVar24->header = '\0';
      while (pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 1),
            ((anonymous_namespace)::chartype_table[bVar19] & 8) != 0) {
        bVar19 = (byte)pxVar24->header;
      }
      pxVar44 = pxVar24;
      pxVar45 = pxVar24;
      xVar30 = status_bad_attribute;
      if (bVar19 != 0x3d) goto LAB_001202c5;
      do {
        pxVar24 = pxVar45;
        bVar19 = (byte)pxVar24->header;
        pxVar45 = (xml_node_struct *)((long)&pxVar24->header + 1);
      } while (((anonymous_namespace)::chartype_table[bVar19] & 8) != 0);
      xVar30 = status_bad_attribute;
      if ((bVar19 != 0x22) && (pxVar44 = pxVar24, bVar19 != 0x27)) goto LAB_001202c5;
      pxVar23->value = (char_t *)pxVar45;
      pxVar24 = (xml_node_struct *)(*local_48)(pxVar45);
      if (pxVar24 == (xml_node_struct *)0x0) {
        pxVar24 = (xml_node_struct *)0x0;
        pxVar44 = (xml_node_struct *)pxVar23->value;
        goto LAB_001202c5;
      }
      bVar18 = true;
      pxVar44 = pxVar24;
      xVar30 = status_bad_attribute;
      if ((char)(anonymous_namespace)::chartype_table[(byte)pxVar24->header] < '\0')
      goto LAB_001202c5;
    }
    pxVar44 = pxVar24;
    pxVar47 = local_b8;
    if (!bVar18) goto LAB_00120676;
  }
  if (bVar19 == 0x3e) goto LAB_0011f982;
  if (bVar19 == 0x2f) {
    cVar4 = (char_t)pxVar44->header;
    if (cVar4 == '>') {
      pxVar22 = pxVar22->parent;
      pxVar44 = (xml_node_struct *)((long)&pxVar24->header + 2);
      goto LAB_0011f982;
    }
    pxVar24 = pxVar44;
    if ((endch == 0x3e) && (cVar4 == '\0')) {
      pxVar22 = pxVar22->parent;
      goto LAB_0011f982;
    }
  }
  else if ((endch == 0x3e) && (pxVar44 = pxVar24, bVar19 == 0)) goto LAB_0011f982;
LAB_00120833:
  local_d0.error_offset = (char_t *)pxVar24;
  local_d0.error_status = status_bad_start_element;
  goto LAB_00120676;
code_r0x0011fad1:
  pxVar24 = (xml_node_struct *)((long)&pxVar24->header + 1);
  bVar1 = *pbVar36;
  pbVar36 = pbVar36 + 1;
  if (bVar19 != bVar1) goto LAB_001200d5;
  goto LAB_0011fac4;
LAB_00120676:
  uVar25 = (long)local_d0.error_offset - (long)local_38;
  if ((xml_node_struct *)local_d0.error_offset == (xml_node_struct *)0x0) {
    uVar25 = 0;
  }
  if (((long)uVar25 < 0) || (local_40 < uVar25)) {
    __assert_fail("result.offset >= 0 && static_cast<size_t>(result.offset) <= length",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0xdc8,
                  "static xml_parse_result pugi::impl::(anonymous namespace)::xml_parser::parse(char_t *, size_t, xml_document_struct *, xml_node_struct *, unsigned int)"
                 );
  }
  if (local_d0.error_status == status_ok) {
    if (endch == 0x3c) {
      pxVar47->encoding = encoding_auto;
      pxVar47->status = status_unrecognized_tag;
LAB_001206f3:
      pxVar47->offset = local_90;
      goto LAB_001206fc;
    }
    if ((options >> 0xc & 1) == 0) {
      ppxVar38 = &local_68->next_sibling;
      if (local_68 == (xml_node_struct *)0x0) {
        ppxVar38 = local_58;
      }
      for (pxVar44 = *ppxVar38; pxVar44 != (xml_node_struct *)0x0; pxVar44 = pxVar44->next_sibling)
      {
        if ((pxVar44->header & 0xf) == 2) goto LAB_001206cc;
      }
      if (pxVar44 == (xml_node_struct *)0x0) {
        pxVar47->encoding = encoding_auto;
        pxVar47->status = status_no_document_element;
        goto LAB_001206f3;
      }
    }
  }
  else if (0 < (long)uVar25) {
    uVar25 = uVar25 - (endch == 0 && uVar25 == local_90);
  }
LAB_001206cc:
  pxVar47->status = local_d0.error_status;
  pxVar47->offset = uVar25;
  pxVar47->encoding = encoding_auto;
  goto LAB_001206fc;
}

Assistant:

PUGI__FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// get private buffer
		char_t* buffer = 0;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}